

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::erase
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,iterator pos)

{
  pointer pvVar1;
  long *in_RSI;
  iterator *in_RDI;
  Node *in_stack_00000008;
  InnerMap *in_stack_00000010;
  size_type in_stack_00000018;
  iterator i;
  InnerMap *in_stack_000000d0;
  undefined1 in_stack_000000e0 [24];
  iterator *this_00;
  
  this_00 = in_RDI;
  if ((*in_RSI == 0) &&
     (pvVar1 = iterator::operator->((iterator *)0x4374da), pvVar1 != (pointer)0x0)) {
    MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>::~MapPair
              ((MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)0x4374ef);
    operator_delete(pvVar1);
  }
  iterator::operator++(this_00,(int)((ulong)in_RDI >> 0x20));
  InnerMap::erase(in_stack_000000d0,(iterator)in_stack_000000e0);
  (in_RDI->it_).node_ = in_stack_00000008;
  (in_RDI->it_).m_ = in_stack_00000010;
  (in_RDI->it_).bucket_index_ = in_stack_00000018;
  return this_00;
}

Assistant:

iterator erase(iterator pos) {
    if (arena_ == NULL) delete pos.operator->();
    iterator i = pos++;
    elements_->erase(i.it_);
    return pos;
  }